

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBaseRunner.cpp
# Opt level: O0

int __thiscall xmrig::OclBaseRunner::init(OclBaseRunner *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  OclVendor OVar2;
  undefined4 extraout_var;
  cl_command_queue p_Var3;
  char *__s;
  OclBaseRunner *this_00;
  undefined4 extraout_var_01;
  size_t sVar4;
  undefined4 extraout_var_02;
  cl_mem p_Var5;
  int __c;
  cl_device_id in_stack_00000008;
  cl_context in_stack_00000010;
  size_t size;
  cl_context in_stack_00000020;
  cl_context in_stack_00000028;
  OclSharedData *in_stack_00000030;
  size_t in_stack_ffffffffffffffd8;
  OclBaseRunner *this_01;
  undefined4 extraout_var_00;
  
  this_01 = (OclBaseRunner *)this->m_ctx;
  iVar1 = (*(this->super_IOclRunner)._vptr_IOclRunner[6])();
  OclDevice::id((OclDevice *)(CONCAT44(extraout_var,iVar1) + 0x20));
  p_Var3 = OclLib::createCommandQueue(in_stack_00000010,in_stack_00000008);
  this->m_queue = p_Var3;
  iVar1 = (*(this->super_IOclRunner)._vptr_IOclRunner[0xe])();
  __s = (char *)CONCAT44(extraout_var_00,iVar1);
  this_00 = (OclBaseRunner *)align(this_01,in_stack_ffffffffffffffd8);
  if (this_00 < (OclBaseRunner *)0x40000000) {
    iVar1 = (*(this->super_IOclRunner)._vptr_IOclRunner[6])();
    OVar2 = OclDevice::vendorId((OclDevice *)(CONCAT44(extraout_var_01,iVar1) + 0x20));
    if (OVar2 == OCL_VENDOR_AMD) {
      (*(this->super_IOclRunner)._vptr_IOclRunner[6])();
      sVar4 = OclDevice::freeMemSize((OclDevice *)this_00);
      if (0x3fffffff < sVar4) {
        iVar1 = (*(this->super_IOclRunner)._vptr_IOclRunner[6])();
        OclDevice::index((OclDevice *)(CONCAT44(extraout_var_02,iVar1) + 0x20),__s,__c);
        OclSharedState::get(0);
        p_Var5 = OclSharedData::createBuffer
                           (in_stack_00000030,in_stack_00000028,(size_t)in_stack_00000020,
                            (size_t *)size);
        this->m_buffer = p_Var5;
        goto LAB_00216414;
      }
    }
  }
  p_Var5 = OclLib::createBuffer(in_stack_00000020,size,(size_t)in_stack_00000010,in_stack_00000008);
  this->m_buffer = p_Var5;
LAB_00216414:
  p_Var5 = createSubBuffer(this_00,(cl_mem_flags)this,(size_t)this_01);
  this->m_input = p_Var5;
  p_Var5 = createSubBuffer(this_00,(cl_mem_flags)this,(size_t)this_01);
  this->m_output = p_Var5;
  return (int)this;
}

Assistant:

void xmrig::OclBaseRunner::init()
{
    m_queue = OclLib::createCommandQueue(m_ctx, data().device.id());

    size_t size = align(bufferSize());

    if (size < oneGiB && data().device.vendorId() == OCL_VENDOR_AMD && data().device.freeMemSize() >= oneGiB) {
        m_buffer = OclSharedState::get(data().device.index()).createBuffer(m_ctx, size, m_offset);
    }
    else {
        m_buffer = OclLib::createBuffer(m_ctx, CL_MEM_READ_WRITE, size);
    }

    m_input  = createSubBuffer(CL_MEM_READ_ONLY | CL_MEM_HOST_WRITE_ONLY, Job::kMaxBlobSize);
    m_output = createSubBuffer(CL_MEM_READ_WRITE, sizeof(cl_uint) * 0x100);
}